

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttp2connection_p.cpp
# Opt level: O1

int __thiscall QHttp2Connection::qt_metacall(QHttp2Connection *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 0xe) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -0xe;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 0xe) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,_id_00,_a);
      }
      _id_00 = _id_00 + -0xe;
    }
  }
  return _id_00;
}

Assistant:

int QHttp2Connection::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 14)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 14;
    }
    return _id;
}